

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

void insert_to_b(bidx_t *b,int bin,uint64_t beg,uint64_t end)

{
  int iVar1;
  hts_pair64_t *phVar2;
  int local_3c;
  bins_t *pbStack_38;
  int absent;
  bins_t *l;
  uint64_t uStack_28;
  khint_t k;
  uint64_t end_local;
  uint64_t beg_local;
  bidx_t *pbStack_10;
  int bin_local;
  bidx_t *b_local;
  
  uStack_28 = end;
  end_local = beg;
  beg_local._4_4_ = bin;
  pbStack_10 = b;
  l._4_4_ = kh_put_bin(b,bin,&local_3c);
  pbStack_38 = pbStack_10->vals + l._4_4_;
  if (local_3c != 0) {
    pbStack_38->m = 1;
    pbStack_38->n = 0;
    phVar2 = (hts_pair64_t *)calloc((long)pbStack_38->m,0x10);
    pbStack_38->list = phVar2;
  }
  if (pbStack_38->n == pbStack_38->m) {
    pbStack_38->m = pbStack_38->m << 1;
    phVar2 = (hts_pair64_t *)realloc(pbStack_38->list,(long)pbStack_38->m << 4);
    pbStack_38->list = phVar2;
  }
  pbStack_38->list[pbStack_38->n].u = end_local;
  iVar1 = pbStack_38->n;
  pbStack_38->n = iVar1 + 1;
  pbStack_38->list[iVar1].v = uStack_28;
  return;
}

Assistant:

static inline void insert_to_b(bidx_t *b, int bin, uint64_t beg, uint64_t end)
{
    khint_t k;
    bins_t *l;
    int absent;
    k = kh_put(bin, b, bin, &absent);
    l = &kh_value(b, k);
    if (absent) {
        l->m = 1; l->n = 0;
        l->list = (hts_pair64_t*)calloc(l->m, sizeof(hts_pair64_t));
    }
    if (l->n == l->m) {
        l->m <<= 1;
        l->list = (hts_pair64_t*)realloc(l->list, l->m * sizeof(hts_pair64_t));
    }
    l->list[l->n].u = beg;
    l->list[l->n++].v = end;
}